

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)

{
  lhcell *pCell;
  lhpage *pPage_local;
  lhash_kv_engine *pEngine_local;
  
  pEngine_local = (lhash_kv_engine *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x80);
  if (pEngine_local == (lhash_kv_engine *)0x0) {
    pEngine_local = (lhash_kv_engine *)0x0;
  }
  else {
    SyZero(pEngine_local,0x80);
    SyBlobInit((SyBlob *)&(pEngine_local->sAllocator).nMagic,&pEngine->sAllocator);
    *(lhpage **)&(pEngine_local->sAllocator).nBlock = pPage;
  }
  return (lhcell *)pEngine_local;
}

Assistant:

static lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)
{
	lhcell *pCell;
	pCell = (lhcell *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhcell));
	if( pCell == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pCell,sizeof(lhcell));
	/* Fill in the structure */
	SyBlobInit(&pCell->sKey,&pEngine->sAllocator);
	pCell->pPage = pPage;
	return pCell;
}